

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O1

void __thiscall
Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
          (DenseStorage<double,__1,__1,_1,_0> *this,Index size,Index rows,Index param_3)

{
  double *pdVar1;
  undefined8 *puVar2;
  
  if (this->m_rows != size) {
    free(this->m_data);
    if (size == 0) {
      pdVar1 = (double *)0x0;
    }
    else {
      if ((ulong)size >> 0x3d != 0) {
LAB_001e94ce:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = acos;
        __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pdVar1 = (double *)malloc(size * 8);
      if (size != 1 && ((ulong)pdVar1 & 0xf) != 0) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade alignd memory allocator.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/util/Memory.h"
                      ,0xa1,"void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pdVar1 == (double *)0x0) goto LAB_001e94ce;
    }
    this->m_data = pdVar1;
  }
  this->m_rows = rows;
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void resize(Index size, Index rows, Index)
    {
      if(size != m_rows*_Cols)
      {
        internal::conditional_aligned_delete_auto<T,(_Options&DontAlign)==0>(m_data, _Cols*m_rows);
        if (size)
          m_data = internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size);
        else
          m_data = 0;
        EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN({})
      }
      m_rows = rows;
    }